

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O1

void enumEitherTrie(UTrie2 *trie,UChar32 start,UChar32 limit,UTrie2EnumValue *enumValue,
                   UTrie2EnumRange *enumRange,void *context)

{
  UNewTrie2 *pUVar1;
  uint32_t *puVar2;
  uint uVar3;
  UBool UVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  code *pcVar11;
  uint32_t **ppuVar12;
  uint uVar13;
  uint16_t *puVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  UChar32 UVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint32_t uVar26;
  bool bVar27;
  uint local_9c;
  uint local_6c;
  ulong local_60;
  
  if (enumRange == (UTrie2EnumRange *)0x0) {
    return;
  }
  pcVar11 = enumSameValue;
  if (enumValue != (UTrie2EnumValue *)0x0) {
    pcVar11 = enumValue;
  }
  pUVar1 = trie->newTrie;
  uVar20 = (ulong)(uint)start;
  if (pUVar1 == (UNewTrie2 *)0x0) {
    puVar14 = trie->index;
    ppuVar12 = &trie->data32;
    local_6c = (uint)trie->index2NullOffset;
    local_9c = (uint)trie->dataNullOffset;
  }
  else {
    ppuVar12 = &pUVar1->data;
    local_6c = pUVar1->index2NullOffset;
    local_9c = pUVar1->dataNullOffset;
    puVar14 = (uint16_t *)0x0;
  }
  puVar2 = *ppuVar12;
  iVar24 = trie->highStart;
  uVar5 = (*pcVar11)(context,trie->initialValue);
  bVar27 = start < limit;
  uVar26 = 0;
  uVar16 = uVar20;
  if (start < iVar24 && bVar27) {
    uVar26 = 0;
    uVar25 = 0xffffffff;
    uVar13 = 0xffffffff;
    do {
      uVar3 = (uint)uVar16;
      uVar17 = uVar3 + 0x800;
      uVar6 = limit;
      if ((int)uVar17 < limit) {
        uVar6 = uVar17;
      }
      iVar23 = (int)uVar20;
      if ((int)uVar3 < 0x10000) {
        if ((uVar3 & 0xfffff800) == 0xd800) {
          uVar22 = 0x6c0;
          if ((uVar16 & 0x400) == 0) {
            uVar22 = 0x800;
          }
          uVar6 = (uVar3 & 0x400) + 0xdc00;
          if (limit <= (int)uVar6) {
            uVar6 = limit;
          }
        }
        else {
          uVar22 = (int)uVar3 >> 5;
        }
LAB_001bf82f:
        uVar10 = uVar26;
        uVar8 = uVar25;
        uVar13 = uVar22;
        if (uVar22 == local_6c) {
          uVar21 = uVar20;
          if (((uVar26 != uVar5) &&
              (uVar21 = uVar16, uVar10 = uVar5, uVar8 = local_9c, iVar23 < (int)uVar3)) &&
             (UVar4 = (*enumRange)(context,iVar23,uVar3 - 1,uVar26), UVar4 == '\0')) {
            iVar15 = 1;
            goto LAB_001bfa7e;
          }
LAB_001bfa75:
          iVar15 = 0;
          uVar20 = uVar21;
        }
        else {
          uVar17 = (uint)(uVar16 >> 5) & 0x3f;
          local_60 = (ulong)uVar17;
          uVar7 = uVar6 >> 5 & 0x3f;
          if (0x7ff < (uVar6 ^ uVar3)) {
            uVar7 = 0x40;
          }
          bVar27 = uVar17 < uVar7;
          uVar17 = uVar3;
          if (bVar27) {
            do {
              if (puVar14 == (uint16_t *)0x0) {
                uVar8 = trie->newTrie->index2[local_60 + (long)(int)uVar22];
              }
              else {
                uVar8 = (uint)puVar14[local_60 + (long)(int)uVar22] << 2;
              }
              iVar23 = (int)uVar20;
              if ((uVar8 == uVar25) && (0x1f < (int)(uVar17 - iVar23))) {
                uVar17 = uVar17 + 0x20;
              }
              else {
                uVar25 = uVar8;
                if (uVar8 == local_9c) {
                  uVar16 = uVar20;
                  uVar9 = uVar26;
                  if ((uVar26 != uVar5) &&
                     (uVar16 = (ulong)uVar17, uVar9 = uVar5, iVar23 < (int)uVar17)) {
                    UVar4 = (*enumRange)(context,iVar23,uVar17 - 1,uVar26);
                    uVar16 = (ulong)uVar17;
                    uVar10 = uVar26;
                    if (UVar4 == '\0') break;
                  }
                  uVar26 = uVar9;
                  uVar17 = uVar17 + 0x20;
                  uVar20 = uVar16;
                }
                else {
                  lVar19 = 0;
                  do {
                    if (puVar2 == (uint32_t *)0x0) {
                      uVar10 = (uint32_t)*(ushort *)((long)puVar14 + lVar19 + (long)(int)uVar8 * 2);
                    }
                    else {
                      uVar10 = *(uint32_t *)((long)puVar2 + lVar19 * 2 + (long)(int)uVar8 * 4);
                    }
                    uVar9 = (*pcVar11)(context,uVar10);
                    uVar16 = uVar20;
                    if (uVar9 != uVar26) {
                      if ((int)uVar20 < (int)uVar17) {
                        UVar4 = (*enumRange)(context,(int)uVar20,uVar17 - 1,uVar26);
                        uVar16 = (ulong)uVar17;
                        uVar10 = uVar26;
                        uVar26 = uVar9;
                        if (UVar4 == '\0') goto LAB_001bfa55;
                      }
                      else {
                        uVar16 = (ulong)uVar17;
                        uVar26 = uVar9;
                      }
                    }
                    uVar17 = uVar17 + 1;
                    lVar19 = lVar19 + 2;
                    uVar20 = uVar16;
                  } while (lVar19 != 0x40);
                }
              }
              local_60 = local_60 + 1;
              bVar27 = local_60 < uVar7;
              uVar10 = uVar26;
              uVar8 = uVar25;
            } while (local_60 != uVar7);
          }
LAB_001bfa55:
          iVar15 = 1;
          uVar21 = uVar20;
          if (!bVar27) goto LAB_001bfa75;
        }
        uVar16 = (ulong)uVar17;
        uVar26 = uVar10;
        uVar25 = uVar8;
      }
      else {
        if (puVar14 == (uint16_t *)0x0) {
          uVar22 = trie->newTrie->index1[uVar16 >> 0xb];
        }
        else {
          uVar22 = (uint)puVar14[(uVar16 >> 0xb) + 0x820];
        }
        if ((uVar22 != uVar13) || (iVar15 = 3, (int)(uVar3 - iVar23) < 0x800)) goto LAB_001bf82f;
        uVar16 = (ulong)uVar17;
      }
LAB_001bfa7e:
      start = (UChar32)uVar20;
      if ((iVar15 != 3) && (iVar15 != 0)) {
        return;
      }
      iVar23 = (int)uVar16;
      bVar27 = iVar23 < limit;
    } while ((iVar23 < limit) && (iVar23 < iVar24));
  }
  iVar24 = (int)uVar16;
  UVar18 = limit;
  if (iVar24 < limit) {
    UVar18 = iVar24;
  }
  if (bVar27) {
    if (puVar14 == (uint16_t *)0x0) {
      uVar5 = trie->newTrie->data[(long)trie->newTrie->dataLength + -4];
    }
    else if (puVar2 == (uint32_t *)0x0) {
      uVar5 = (uint32_t)puVar14[trie->highValueIndex];
    }
    else {
      uVar5 = puVar2[trie->highValueIndex];
    }
    uVar10 = (*pcVar11)(context,uVar5);
    bVar27 = true;
    UVar18 = limit;
    uVar5 = uVar26;
    iVar23 = start;
    if (((uVar10 != uVar26) && (uVar5 = uVar10, iVar23 = iVar24, start < iVar24)) &&
       (UVar4 = (*enumRange)(context,start,iVar24 + -1,uVar26), UVar4 == '\0')) {
      bVar27 = false;
      UVar18 = iVar24;
      uVar5 = uVar26;
      iVar23 = start;
    }
    start = iVar23;
    uVar26 = uVar5;
    if (!bVar27) {
      return;
    }
  }
  (*enumRange)(context,start,UVar18 + -1,uVar26);
  return;
}

Assistant:

static void
enumEitherTrie(const UTrie2 *trie,
               UChar32 start, UChar32 limit,
               UTrie2EnumValue *enumValue, UTrie2EnumRange *enumRange, const void *context) {
    const uint32_t *data32;
    const uint16_t *idx;

    uint32_t value, prevValue, initialValue;
    UChar32 c, prev, highStart;
    int32_t j, i2Block, prevI2Block, index2NullOffset, block, prevBlock, nullBlock;

    if(enumRange==NULL) {
        return;
    }
    if(enumValue==NULL) {
        enumValue=enumSameValue;
    }

    if(trie->newTrie==NULL) {
        /* frozen trie */
        idx=trie->index;
        U_ASSERT(idx!=NULL); /* the following code assumes trie->newTrie is not NULL when idx is NULL */
        data32=trie->data32;

        index2NullOffset=trie->index2NullOffset;
        nullBlock=trie->dataNullOffset;
    } else {
        /* unfrozen, mutable trie */
        idx=NULL;
        data32=trie->newTrie->data;
        U_ASSERT(data32!=NULL); /* the following code assumes idx is not NULL when data32 is NULL */

        index2NullOffset=trie->newTrie->index2NullOffset;
        nullBlock=trie->newTrie->dataNullOffset;
    }

    highStart=trie->highStart;

    /* get the enumeration value that corresponds to an initial-value trie data entry */
    initialValue=enumValue(context, trie->initialValue);

    /* set variables for previous range */
    prevI2Block=-1;
    prevBlock=-1;
    prev=start;
    prevValue=0;

    /* enumerate index-2 blocks */
    for(c=start; c<limit && c<highStart;) {
        /* Code point limit for iterating inside this i2Block. */
        UChar32 tempLimit=c+UTRIE2_CP_PER_INDEX_1_ENTRY;
        if(limit<tempLimit) {
            tempLimit=limit;
        }
        if(c<=0xffff) {
            if(!U_IS_SURROGATE(c)) {
                i2Block=c>>UTRIE2_SHIFT_2;
            } else if(U_IS_SURROGATE_LEAD(c)) {
                /*
                 * Enumerate values for lead surrogate code points, not code units:
                 * This special block has half the normal length.
                 */
                i2Block=UTRIE2_LSCP_INDEX_2_OFFSET;
                tempLimit=MIN_VALUE(0xdc00, limit);
            } else {
                /*
                 * Switch back to the normal part of the index-2 table.
                 * Enumerate the second half of the surrogates block.
                 */
                i2Block=0xd800>>UTRIE2_SHIFT_2;
                tempLimit=MIN_VALUE(0xe000, limit);
            }
        } else {
            /* supplementary code points */
            if(idx!=NULL) {
                i2Block=idx[(UTRIE2_INDEX_1_OFFSET-UTRIE2_OMITTED_BMP_INDEX_1_LENGTH)+
                              (c>>UTRIE2_SHIFT_1)];
            } else {
                i2Block=trie->newTrie->index1[c>>UTRIE2_SHIFT_1];
            }
            if(i2Block==prevI2Block && (c-prev)>=UTRIE2_CP_PER_INDEX_1_ENTRY) {
                /*
                 * The index-2 block is the same as the previous one, and filled with prevValue.
                 * Only possible for supplementary code points because the linear-BMP index-2
                 * table creates unique i2Block values.
                 */
                c+=UTRIE2_CP_PER_INDEX_1_ENTRY;
                continue;
            }
        }
        prevI2Block=i2Block;
        if(i2Block==index2NullOffset) {
            /* this is the null index-2 block */
            if(prevValue!=initialValue) {
                if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                    return;
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }
            c+=UTRIE2_CP_PER_INDEX_1_ENTRY;
        } else {
            /* enumerate data blocks for one index-2 block */
            int32_t i2, i2Limit;
            i2=(c>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
            if((c>>UTRIE2_SHIFT_1)==(tempLimit>>UTRIE2_SHIFT_1)) {
                i2Limit=(tempLimit>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
            } else {
                i2Limit=UTRIE2_INDEX_2_BLOCK_LENGTH;
            }
            for(; i2<i2Limit; ++i2) {
                if(idx!=NULL) {
                    block=(int32_t)idx[i2Block+i2]<<UTRIE2_INDEX_SHIFT;
                } else {
                    block=trie->newTrie->index2[i2Block+i2];
                }
                if(block==prevBlock && (c-prev)>=UTRIE2_DATA_BLOCK_LENGTH) {
                    /* the block is the same as the previous one, and filled with prevValue */
                    c+=UTRIE2_DATA_BLOCK_LENGTH;
                    continue;
                }
                prevBlock=block;
                if(block==nullBlock) {
                    /* this is the null data block */
                    if(prevValue!=initialValue) {
                        if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                            return;
                        }
                        prev=c;
                        prevValue=initialValue;
                    }
                    c+=UTRIE2_DATA_BLOCK_LENGTH;
                } else {
                    for(j=0; j<UTRIE2_DATA_BLOCK_LENGTH; ++j) {
                        value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                        if(value!=prevValue) {
                            if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                                return;
                            }
                            prev=c;
                            prevValue=value;
                        }
                        ++c;
                    }
                }
            }
        }
    }

    if(c>limit) {
        c=limit;  /* could be higher if in the index2NullOffset */
    } else if(c<limit) {
        /* c==highStart<limit */
        uint32_t highValue;
        if(idx!=NULL) {
            highValue=
                data32!=NULL ?
                    data32[trie->highValueIndex] :
                    idx[trie->highValueIndex];
        } else {
            highValue=trie->newTrie->data[trie->newTrie->dataLength-UTRIE2_DATA_GRANULARITY];
        }
        value=enumValue(context, highValue);
        if(value!=prevValue) {
            if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                return;
            }
            prev=c;
            prevValue=value;
        }
        c=limit;
    }

    /* deliver last range */
    enumRange(context, prev, c-1, prevValue);
}